

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O2

void av1_lowbd_fwd_txfm2d_8x16_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  int8_t *piVar5;
  undefined7 in_register_00000009;
  long lVar6;
  __m128i *in;
  __m128i buf0 [16];
  __m128i buf1 [16];
  
  piVar5 = av1_fwd_txfm_shift_ls[7];
  uVar3 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar1 = *(code **)((long)col_txfm8x16_arr + (ulong)(uVar3 * 8));
  pcVar2 = *(code **)((long)row_txfm8x8_arr + (ulong)(uVar3 * 8));
  bVar4 = false;
  if (uVar3 < 0x10) {
    if ((0x4110U >> (uVar3 & 0x1f) & 1) != 0) {
LAB_0041daa3:
      load_buffer_16bit_to_16bit_flip(input,stride,buf0,0x10);
      goto LAB_0041dab5;
    }
    if ((0x80a0U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 6) {
        bVar4 = true;
        goto LAB_0041daa3;
      }
    }
    else {
      bVar4 = true;
    }
  }
  load_buffer_16bit_to_16bit(input,stride,buf0,0x10);
LAB_0041dab5:
  round_shift_16bit(buf0,0x10,(int)*piVar5);
  (*pcVar1)(buf0,buf0,0xd);
  round_shift_16bit(buf0,0x10,(int)piVar5[1]);
  transpose_16bit_8x8(buf0,buf1);
  transpose_16bit_8x8(buf0 + 8,buf1 + 8);
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 0x80) {
    in = (__m128i *)((long)buf1[0] + lVar6);
    if (bVar4) {
      flip_buf_sse2(in,buf0,8);
      in = buf0;
    }
    (*pcVar2)(in,in,0xd);
    round_shift_16bit(in,8,(int)piVar5[2]);
    store_rect_buffer_16bit_to_32bit_w8(in,output,0x10,8);
    output = output + 8;
  }
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_8x16_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 16;
  const transform_1d_sse2 col_txfm = col_txfm8x16_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x8_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);
  transpose_16bit_8x8(buf0 + 8, buf1 + 8);

  for (int i = 0; i < 2; i++) {
    __m128i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_sse2(buf1 + width * i, buf, width);
    } else {
      buf = buf1 + width * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_rect_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
  }
}